

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Scope::Scope(Scope *this,Parser *parser,bool topLevel)

{
  _Rb_tree_header *p_Var1;
  Token *token;
  TokenPtr token_00;
  Element *this_00;
  undefined8 extraout_RAX;
  undefined7 in_register_00000011;
  allocator local_85;
  int local_84;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>,std::_Select1st<std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>>>
  *local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>
  local_78;
  string local_50;
  
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->elements)._M_t._M_impl.super__Rb_tree_header;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_84 = (int)CONCAT71(in_register_00000011,topLevel);
  local_80 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>,std::_Select1st<std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>>>
              *)this;
  if ((local_84 == 0) && (token = parser->current, token->type != TokenType_OPEN_BRACKET)) {
    std::__cxx11::string::string((string *)&local_78,"expected open bracket",(allocator *)&local_50)
    ;
    anon_unknown.dwarf_1e32c8::ParseError(&local_78.first,token);
  }
  token_00 = Parser::AdvanceToNextToken(parser);
  if (token_00 == (TokenPtr)0x0) {
    std::__cxx11::string::string
              ((string *)&local_78,"unexpected end of file",(allocator *)&local_50);
    anon_unknown.dwarf_1e32c8::ParseError(&local_78.first,(Element *)0x0);
  }
  while( true ) {
    if (token_00->type != TokenType_KEY) {
      if (token_00->type == TokenType_CLOSE_BRACKET) {
        return;
      }
      std::__cxx11::string::string
                ((string *)&local_78,"unexpected token, expected TOK_KEY",(allocator *)&local_50);
      anon_unknown.dwarf_1e32c8::ParseError(&local_78.first,token_00);
    }
    Token::StringContents_abi_cxx11_(&local_50,token_00);
    this_00 = (Element *)operator_new(0x28);
    Element::Element(this_00,token_00,parser);
    std::__cxx11::string::string((string *)&local_78,(string *)&local_50);
    local_78.second = this_00;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>,std::_Select1st<std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>>>
    ::_M_insert_equal<std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>>
              (local_80,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    token_00 = parser->current;
    if (token_00 == (TokenPtr)0x0) break;
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((char)local_84 != '\0') {
    std::__cxx11::string::~string((string *)&local_50);
    return;
  }
  std::__cxx11::string::string((string *)&local_78,"unexpected end of file",&local_85);
  anon_unknown.dwarf_1e32c8::ParseError(&local_78.first,parser->last);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_50);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
               *)local_80);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Scope::Scope(Parser& parser,bool topLevel)
{
    if(!topLevel) {
        TokenPtr t = parser.CurrentToken();
        if (t->Type() != TokenType_OPEN_BRACKET) {
            ParseError("expected open bracket",t);
        }
    }

    TokenPtr n = parser.AdvanceToNextToken();
    if(n == NULL) {
        ParseError("unexpected end of file");
    }

    // note: empty scopes are allowed
    while(n->Type() != TokenType_CLOSE_BRACKET) {
        if (n->Type() != TokenType_KEY) {
            ParseError("unexpected token, expected TOK_KEY",n);
        }

        const std::string& str = n->StringContents();
        elements.insert(ElementMap::value_type(str,new_Element(*n,parser)));

        // Element() should stop at the next Key token (or right after a Close token)
        n = parser.CurrentToken();
        if(n == NULL) {
            if (topLevel) {
                return;
            }
            ParseError("unexpected end of file",parser.LastToken());
        }
    }
}